

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O1

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this)

{
  Value *val;
  Module *pMVar1;
  Module *pMVar2;
  NodesSeq<dg::dda::RWNode> cur;
  NodesSeq<dg::dda::RWNode> local_48;
  
  pMVar2 = *(Module **)(this->_module + 0x10);
  pMVar1 = this->_module + 8;
  if (pMVar2 != pMVar1) {
    do {
      val = (Value *)(pMVar2 + -0x38);
      if (pMVar2 == (Module *)0x0) {
        val = (Value *)0x0;
      }
      buildNode(&local_48,this,val);
      std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
                ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&this->_globals,
                 (this->_globals).
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_48.nodes.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_48.nodes.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_48.nodes.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.nodes.
                        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.nodes.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.nodes.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pMVar2 = *(Module **)(pMVar2 + 8);
    } while (pMVar2 != pMVar1);
  }
  return;
}

Assistant:

void buildGlobals() {
        DBG_SECTION_BEGIN(dg, "Building globals");

        for (const auto &G : _module->globals()) {
            // every global node is like memory allocation
            auto cur = buildNode(&G);
            _globals.insert(_globals.end(), cur.begin(), cur.end());
        }

        DBG_SECTION_END(dg, "Building globals done");
    }